

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void update_layer_buffer_level(SVC *svc,int encoded_frame_size,_Bool is_screen)

{
  long lVar1;
  byte in_DL;
  int in_ESI;
  int *in_RDI;
  double dVar2;
  PRIMARY_RATE_CONTROL *lp_rc;
  LAYER_CONTEXT *lc;
  int layer;
  int i;
  int current_temporal_layer;
  long local_40;
  undefined8 local_38;
  int local_18;
  
  local_18 = in_RDI[1];
  while (local_18 = local_18 + 1, local_18 < in_RDI[3]) {
    lVar1 = *(long *)(in_RDI + 0x56) + (long)(*in_RDI * in_RDI[3] + local_18) * 0x3380;
    dVar2 = round((double)*(long *)(lVar1 + 0x3330) / *(double *)(lVar1 + 0x3340));
    *(long *)(lVar1 + 0x2368) = (long)((int)dVar2 - in_ESI) + *(long *)(lVar1 + 0x2368);
    if (*(long *)(lVar1 + 0x2368) < *(long *)(lVar1 + 0x2290)) {
      local_38 = *(undefined8 *)(lVar1 + 0x2368);
    }
    else {
      local_38 = *(undefined8 *)(lVar1 + 0x2290);
    }
    *(undefined8 *)(lVar1 + 0x2368) = local_38;
    *(undefined8 *)(lVar1 + 0x2348) = *(undefined8 *)(lVar1 + 0x2368);
    if ((in_DL & 1) != 0) {
      if (-*(long *)(lVar1 + 0x2290) < *(long *)(lVar1 + 0x2368)) {
        local_40 = *(long *)(lVar1 + 0x2368);
      }
      else {
        local_40 = -*(long *)(lVar1 + 0x2290);
      }
      *(long *)(lVar1 + 0x2368) = local_40;
      *(undefined8 *)(lVar1 + 0x2348) = *(undefined8 *)(lVar1 + 0x2368);
    }
  }
  return;
}

Assistant:

static void update_layer_buffer_level(SVC *svc, int encoded_frame_size,
                                      bool is_screen) {
  const int current_temporal_layer = svc->temporal_layer_id;
  for (int i = current_temporal_layer + 1; i < svc->number_temporal_layers;
       ++i) {
    const int layer =
        LAYER_IDS_TO_IDX(svc->spatial_layer_id, i, svc->number_temporal_layers);
    LAYER_CONTEXT *lc = &svc->layer_context[layer];
    PRIMARY_RATE_CONTROL *lp_rc = &lc->p_rc;
    lp_rc->bits_off_target +=
        (int)round(lc->target_bandwidth / lc->framerate) - encoded_frame_size;
    // Clip buffer level to maximum buffer size for the layer.
    lp_rc->bits_off_target =
        AOMMIN(lp_rc->bits_off_target, lp_rc->maximum_buffer_size);
    lp_rc->buffer_level = lp_rc->bits_off_target;

    // For screen-content mode: don't let buffer level go below threshold,
    // given here as -rc->maximum_ buffer_size, to allow buffer to come back
    // up sooner after slide change with big overshoot.
    if (is_screen) {
      lp_rc->bits_off_target =
          AOMMAX(lp_rc->bits_off_target, -lp_rc->maximum_buffer_size);
      lp_rc->buffer_level = lp_rc->bits_off_target;
    }
  }
}